

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall ctemplate::Template::~Template(Template *this)

{
  HtmlParser *this_00;
  ostream *poVar1;
  char *pcVar2;
  Template *this_local;
  
  this->_vptr_Template = (_func_int **)&PTR__Template_001b5100;
  if (1 < kVerbosity) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"2: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"Deleting Template for ");
    pcVar2 = template_file(this);
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"; with context ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->initial_context_);
    poVar1 = std::operator<<(poVar1,"; and strip ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->strip_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  num_deletes_ = num_deletes_ + 1;
  if (this->tree_ != (SectionTemplateNode *)0x0) {
    (*(this->tree_->super_TemplateNode)._vptr_TemplateNode[1])();
  }
  if (this->template_text_ != (char *)0x0) {
    operator_delete__(this->template_text_);
  }
  this_00 = this->htmlparser_;
  if (this_00 != (HtmlParser *)0x0) {
    ctemplate_htmlparser::HtmlParser::~HtmlParser(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)&this->resolved_filename_);
  std::__cxx11::string::~string((string *)&this->original_filename_);
  return;
}

Assistant:

Template::~Template() {
  VLOG(2) << endl << "Deleting Template for " << template_file()
          << "; with context " << initial_context_
          << "; and strip " << strip_ << endl;
  // Since this is only used by tests, we don't bother with locking
  num_deletes_++;
  delete tree_;
  // Delete this last, since tree has pointers into template_text_
  delete[] template_text_;
  delete htmlparser_;
}